

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O0

string * join<int>(vector<int,_std::allocator<int>_> *values,string *delim)

{
  size_type sVar1;
  const_reference pvVar2;
  string *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  string *in_RDI;
  size_t i;
  ostringstream str;
  ulong local_198;
  ostringstream local_190 [376];
  string *local_18;
  vector<int,_std::allocator<int>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_198 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(local_10);
    if (sVar1 <= local_198) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_10,local_198);
    std::ostream::operator<<((ostream *)local_190,*pvVar2);
    sVar1 = std::vector<int,_std::allocator<int>_>::size(local_10);
    if (local_198 < sVar1 - 1) {
      std::operator<<((ostream *)local_190,local_18);
    }
    local_198 = local_198 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

static std::string join(const std::vector<T> & values, const std::string & delim) {
    std::ostringstream str;
    for (size_t i = 0; i < values.size(); i++) {
        str << values[i];
        if (i < values.size() - 1) {
            str << delim;
        }
    }
    return str.str();
}